

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int Score(string *modelFile)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  double dVar4;
  NJamSpell local_160 [8];
  wstring wtext;
  string local_140 [8];
  string line;
  undefined1 local_110 [8];
  TLangModel model;
  string *modelFile_local;
  
  model.CheckSum = (uint64_t)modelFile;
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_110);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = NJamSpell::TLangModel::Load((TLangModel *)local_110,(string *)model.CheckSum);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loaded");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cerr,">> ");
    std::__cxx11::string::string(local_140);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,local_140);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      NJamSpell::UTF8ToWide(local_160,(string *)local_140);
      dVar4 = NJamSpell::TLangModel::Score((TLangModel *)local_110,(wstring *)local_160);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,dVar4);
      std::operator<<(poVar2,"\n");
      std::operator<<((ostream *)&std::cerr,">> ");
      std::__cxx11::wstring::~wstring((wstring *)local_160);
    }
    std::__cxx11::string::~string(local_140);
    modelFile_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    modelFile_local._4_4_ = 0x2a;
  }
  NJamSpell::TLangModel::~TLangModel((TLangModel *)local_110);
  return modelFile_local._4_4_;
}

Assistant:

int Score(const std::string& modelFile) {
    TLangModel model;
    std::cerr << "[info] loading model" << std::endl;
    if (!model.Load(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }
    std::cerr << "[info] loaded" << std::endl;
    std::cerr << ">> ";
    for (std::string line; std::getline(std::cin, line);) {
        std::wstring wtext = UTF8ToWide(line);
        std::cerr << model.Score(wtext) << "\n";
        std::cerr << ">> ";
    }
    return 0;
}